

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cMultiBindTests.cpp
# Opt level: O2

IterateResult __thiscall
gl4cts::MultiBind::ErrorsBindVertexBuffersTest::iterate(ErrorsBindVertexBuffersTest *this)

{
  ostringstream *poVar1;
  int iVar2;
  char cVar3;
  int iVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  long lVar6;
  long lVar7;
  TestError *pTVar8;
  long lVar9;
  GLuint GVar10;
  Buffer *this_00;
  GLint GVar11;
  GLuint vao;
  GLint max_buffers;
  GLsizei t_strides [4];
  GLuint buffer_ids [4];
  GLsizei strides [4];
  GLuint t_buffer_ids [4];
  GLintptr offsets [4];
  Enum<int,_2UL> local_238;
  Enum<int,_2UL> local_228;
  Buffer buffer [4];
  undefined1 local_1b0 [384];
  
  iVar4 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar9 = CONCAT44(extraout_var,iVar4);
  max_buffers = 0;
  (**(code **)(lVar9 + 0x868))(0x82da,&max_buffers);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"GetIntegerv",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x8cc);
  iVar4 = 3;
  if (max_buffers < 4) {
    iVar4 = max_buffers + -1;
  }
  lVar6 = (long)iVar4;
  lVar7 = 0x10;
  do {
    *(undefined4 *)((long)buffer + lVar7 + -0x10) = 0xffffffff;
    *(undefined8 *)((long)buffer + lVar7 + -8) = 0;
    *(undefined4 *)((long)&buffer[0].m_id + lVar7) = 0x8892;
    lVar7 = lVar7 + 0x18;
  } while (lVar7 != 0x70);
  GVar11 = max_buffers;
  if (3 < max_buffers) {
    GVar11 = 4;
  }
  this_00 = buffer;
  for (lVar7 = 0; lVar7 != 0x10; lVar7 = lVar7 + 4) {
    MultiBind::Buffer::InitData
              (this_00,(this->super_TestCase).m_context,0x8892,0x88ea,0x10,(GLvoid *)0x0);
    *(GLuint *)((long)buffer_ids + lVar7) = this_00->m_id;
    *(undefined8 *)((long)offsets + lVar7 * 2) = 4;
    *(undefined4 *)((long)strides + lVar7) = 4;
    this_00 = this_00 + 1;
  }
  vao = 0;
  GVar10 = 1;
  (**(code **)(lVar9 + 0x708))(1);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"GenVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x8ea);
  (**(code **)(lVar9 + 0xd8))(vao);
  dVar5 = (**(code **)(lVar9 + 0x800))();
  glu::checkError(dVar5,"BindVertexArrays",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                  ,0x8ee);
  iVar4 = max_buffers + 1;
  iVar2 = 0;
  if (3 < max_buffers) {
    iVar4 = 4;
    iVar2 = max_buffers + -3;
  }
  (**(code **)(lVar9 + 0xe8))(iVar2,iVar4,buffer_ids,offsets,strides);
  t_buffer_ids[2] = (**(code **)(lVar9 + 0x800))();
  if (t_buffer_ids[2] != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"File: ");
    std::operator<<((ostream *)poVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   );
    std::operator<<((ostream *)poVar1,", line: ");
    std::ostream::operator<<(poVar1,0x902);
    std::operator<<((ostream *)poVar1,". Got wrong error: ");
    t_buffer_ids._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_buffer_ids,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", expected: ");
    t_strides._0_8_ = glu::getErrorName;
    t_strides[2] = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_strides,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", message: ");
    std::operator<<((ostream *)poVar1,"BindVertexBuffers with invalid <first> + <count>");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x902);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  while (cVar3 = (**(code **)(lVar9 + 0xc68))(GVar10), cVar3 == '\x01') {
    GVar10 = GVar10 + 1;
  }
  t_buffer_ids[lVar6] = GVar10;
  (**(code **)(lVar9 + 0xe8))(0,GVar11,t_buffer_ids,offsets,strides);
  t_strides[2] = (**(code **)(lVar9 + 0x800))();
  if (t_strides[2] != 0x502) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"File: ");
    std::operator<<((ostream *)poVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   );
    std::operator<<((ostream *)poVar1,", line: ");
    std::ostream::operator<<(poVar1,0x91d);
    std::operator<<((ostream *)poVar1,". Got wrong error: ");
    t_strides._0_8_ = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream((Enum<int,_2UL> *)t_strides,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", expected: ");
    local_238.m_getName = glu::getErrorName;
    local_238.m_value = 0x502;
    tcu::Format::Enum<int,_2UL>::toStream(&local_238,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", message: ");
    std::operator<<((ostream *)poVar1,"BindVertexBuffers with invalid buffer id");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x91d);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  t_buffer_ids[0] = (undefined4)offsets[0];
  t_buffer_ids[1] = offsets[0]._4_4_;
  t_buffer_ids[2] = (undefined4)offsets[1];
  t_buffer_ids[3] = offsets[1]._4_4_;
  (t_buffer_ids + lVar6 * 2)[0] = 0xffffffff;
  (t_buffer_ids + lVar6 * 2)[1] = 0xffffffff;
  t_strides[2] = strides[2];
  t_strides[3] = strides[3];
  t_strides[lVar6] = -1;
  (**(code **)(lVar9 + 0xe8))(0,GVar11,buffer_ids);
  local_238.m_value = (**(code **)(lVar9 + 0x800))();
  if (local_238.m_value != 0x501) {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"File: ");
    std::operator<<((ostream *)poVar1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                   );
    std::operator<<((ostream *)poVar1,", line: ");
    std::ostream::operator<<(poVar1,0x92e);
    std::operator<<((ostream *)poVar1,". Got wrong error: ");
    local_238.m_getName = glu::getErrorName;
    tcu::Format::Enum<int,_2UL>::toStream(&local_238,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", expected: ");
    local_228.m_getName = glu::getErrorName;
    local_228.m_value = 0x501;
    tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)poVar1);
    std::operator<<((ostream *)poVar1,", message: ");
    std::operator<<((ostream *)poVar1,"BindVertexBuffers with negative offset");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar8,"Invalid error generated",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
               ,0x92e);
    __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (**(code **)(lVar9 + 0xe8))(0,GVar11,buffer_ids,offsets,t_strides);
  local_238.m_value = (**(code **)(lVar9 + 0x800))();
  if (local_238.m_value == 0x501) {
    (**(code **)(lVar9 + 0x490))(1,&vao);
    dVar5 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar5,"DeleteVertexArrays",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                    ,0x93b);
    tcu::TestContext::setTestResult
              (((this->super_TestCase).m_context)->m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    lVar9 = 0x48;
    do {
      MultiBind::Buffer::~Buffer((Buffer *)((long)&buffer[0].m_id + lVar9));
      lVar9 = lVar9 + -0x18;
    } while (lVar9 != -0x18);
    return STOP;
  }
  local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::operator<<((ostream *)poVar1,"File: ");
  std::operator<<((ostream *)poVar1,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
                 );
  std::operator<<((ostream *)poVar1,", line: ");
  std::ostream::operator<<(poVar1,0x931);
  std::operator<<((ostream *)poVar1,". Got wrong error: ");
  local_238.m_getName = glu::getErrorName;
  tcu::Format::Enum<int,_2UL>::toStream(&local_238,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1,", expected: ");
  local_228.m_getName = glu::getErrorName;
  local_228.m_value = 0x501;
  tcu::Format::Enum<int,_2UL>::toStream(&local_228,(ostream *)poVar1);
  std::operator<<((ostream *)poVar1,", message: ");
  std::operator<<((ostream *)poVar1,"BindVertexBuffers with negative stride");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  pTVar8 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar8,"Invalid error generated",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cMultiBindTests.cpp"
             ,0x931);
  __cxa_throw(pTVar8,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ErrorsBindVertexBuffersTest::iterate()
{
	const Functions& gl = m_context.getRenderContext().getFunctions();

#if DEBUG_ENBALE_MESSAGE_CALLBACK
	gl.debugMessageCallback(debug_proc, &m_context);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DebugMessageCallback");
#endif /* DEBUG_ENBALE_MESSAGE_CALLBACK */

	static const GLsizei n_buffers = 4;
	static const GLsizei stride	= 4;

	GLintptr buffer_size	 = 16;
	GLsizei  count			 = n_buffers;
	GLuint   first			 = 0;
	GLuint   invalid_id		 = 1; /* Start with 1, as 0 is not valid name */
	GLintptr offset			 = 4; /* ATOMIC and XFB require alignment of 4 */
	GLint	max_buffers	 = 0;
	size_t   validated_index = n_buffers - 1;

	/* Get max */
	gl.getIntegerv(GL_MAX_VERTEX_ATTRIB_BINDINGS, &max_buffers);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GetIntegerv");

	/* Select count so <first + count> does not exceed max.
	 * Validated index shall be in the specified range.
	 */
	if (n_buffers > max_buffers)
	{
		count			= max_buffers;
		validated_index = max_buffers - 1;
	}

	/* Storage */
	Buffer   buffer[n_buffers];
	GLuint   buffer_ids[n_buffers];
	GLintptr offsets[n_buffers];
	GLsizei  strides[n_buffers];

	/* Prepare buffers */
	for (size_t j = 0; j < n_buffers; ++j)
	{
		buffer[j].InitData(m_context, GL_ARRAY_BUFFER, GL_DYNAMIC_COPY, buffer_size, 0 /* data */);

		buffer_ids[j] = buffer[j].m_id;
		offsets[j]	= offset;
		strides[j]	= stride;
	}

	/* Prepare VAO */
	GLuint vao = 0;
	gl.genVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "GenVertexArrays");
	try
	{
		gl.bindVertexArray(vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "BindVertexArrays");

		/* - INVALID_OPERATION when <first> + <count> exceeds limits; */
		{
			GLsizei t_count = n_buffers;
			GLuint  t_first = 0;

			/* Select first so <first + count> exceeds max, avoid negative first */
			if (n_buffers <= max_buffers)
			{
				t_first = max_buffers - n_buffers + 1;
			}
			else
			{
				t_count = max_buffers + 1;
				/* first = 0; */
			}

			/* Test */
			gl.bindVertexBuffers(t_first, t_count, buffer_ids, offsets, strides);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindVertexBuffers with invalid <first> + <count>");
		}

		/* - INVALID_OPERATION if any value in <buffers> is not zero or the name of
		 * existing buffer;
		 */
		{
			GLuint t_buffer_ids[n_buffers];

			memcpy(t_buffer_ids, buffer_ids, sizeof(buffer_ids));

			/* Find invalid id */
			while (1)
			{
				if (GL_TRUE != gl.isBuffer(invalid_id))
				{
					break;
				}

				invalid_id += 1;
			}

			/* Invalidate the entry */
			t_buffer_ids[validated_index] = invalid_id;

			/* Test */
			gl.bindVertexBuffers(first, count, t_buffer_ids, offsets, strides);
			CHECK_ERROR(GL_INVALID_OPERATION, "BindVertexBuffers with invalid buffer id");
		}

		/* - INVALID_VALUE if any value in <offsets> or <strides> is less than zero. */
		{
			GLintptr t_offsets[n_buffers];
			GLsizei  t_strides[n_buffers];

			memcpy(t_offsets, offsets, sizeof(offsets));
			memcpy(t_strides, strides, sizeof(strides));

			/* Invalidate the entry */
			t_offsets[validated_index] = -1;
			t_strides[validated_index] = -1;

			/* Test */
			gl.bindVertexBuffers(first, count, buffer_ids, t_offsets, strides);
			CHECK_ERROR(GL_INVALID_VALUE, "BindVertexBuffers with negative offset");

			gl.bindVertexBuffers(first, count, buffer_ids, offsets, t_strides);
			CHECK_ERROR(GL_INVALID_VALUE, "BindVertexBuffers with negative stride");
		}
	}
	catch (const std::exception&)
	{
		gl.deleteVertexArrays(1, &vao);
		TCU_FAIL("Unexpected error generated");
	}

	gl.deleteVertexArrays(1, &vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "DeleteVertexArrays");

	/* Set result */
	m_context.getTestContext().setTestResult(QP_TEST_RESULT_PASS, "Pass");

	/* Done */
	return tcu::TestNode::STOP;
}